

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O0

void produce(int n)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  void *this;
  int *in_RSI;
  int local_1c;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  int local_10;
  int local_c;
  int i;
  int n_local;
  
  local_c = n;
  for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
    local_1c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_18,&local_1c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_18);
    poVar1 = std::operator<<((ostream *)&std::cout,"Producer (id#");
    __id = std::this_thread::get_id();
    pbVar2 = std::operator<<(poVar1,__id);
    poVar1 = std::operator<<(pbVar2,"): ");
    this = (void *)std::ostream::operator<<(poVar1,local_10);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    in_RSI = &local_10;
    rtb::Concurrency::Queue<int>::push(&q,in_RSI);
  }
  rtb::Concurrency::Queue<int>::close(&q,(int)in_RSI);
  return;
}

Assistant:

void produce(int n) {
    for (int i{ 0 }; i < n; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cout << "Producer (id#" << std::this_thread::get_id() << "): " << i << endl;
        q.push(i);
    }
    // Notify all the consumers that no more data is going to be pushed on the queue
    q.close();
}